

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O1

void __thiscall OpenMD::Atom::Atom(Atom *this,AtomType *at)

{
  bool bVar1;
  RealType RVar2;
  FluctuatingChargeAdapter fca;
  FluctuatingChargeAdapter local_18;
  
  StuntDouble::StuntDouble(&this->super_StuntDouble,otAtom,0);
  (this->super_StuntDouble)._vptr_StuntDouble = (_func_int **)&PTR__StuntDouble_002283b0;
  this->atomType_ = at;
  RVar2 = AtomType::getMass(at);
  (this->super_StuntDouble).mass_ = RVar2;
  bVar1 = AtomType::isFluctuatingCharge(at);
  if (bVar1) {
    local_18.at_ = at;
    RVar2 = FluctuatingChargeAdapter::getChargeMass(&local_18);
    this->chargeMass_ = RVar2;
  }
  else {
    this->chargeMass_ = INFINITY;
  }
  return;
}

Assistant:

Atom::Atom(AtomType* at) :
      StuntDouble(otAtom, &Snapshot::atomData), atomType_(at) {
    mass_ = at->getMass();
    if (at->isFluctuatingCharge()) {
      FluctuatingChargeAdapter fca = FluctuatingChargeAdapter(at);
      chargeMass_                  = fca.getChargeMass();
    } else {
      chargeMass_ = std::numeric_limits<RealType>::infinity();
    }
  }